

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall
Jinx::Impl::Parser::CheckPropertyName
          (Parser *this,LibraryIPtr *library,SymbolListCItr currSym,size_t *symCount)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  Symbol *pSVar4;
  size_t sVar5;
  bool bVar6;
  String name;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_70;
  Symbol *local_50;
  LibraryIPtr *local_48;
  Symbol *local_40;
  size_t *local_38;
  
  if (((this->m_error == false) &&
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish != currSym._M_current)) &&
     ((currSym._M_current)->type == NameValue)) {
    uVar2 = ((library->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->m_maxPropertyParts;
    bVar6 = uVar2 != 0;
    if (bVar6) {
      local_40 = currSym._M_current + 1;
      local_50 = currSym._M_current;
      local_48 = library;
      local_38 = symCount;
      do {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar1 = (local_50->text)._M_dataplus._M_p;
        std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                            &local_70,pcVar1,pcVar1 + (local_50->text)._M_string_length);
        sVar5 = 1;
        if (1 < uVar2) {
          uVar3 = 1;
          pSVar4 = local_40;
          do {
            if (((this->m_error == false) &&
                (pSVar4 != (this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish)) &&
               ((pSVar4->type != NewLine && ((pSVar4->text)._M_string_length != 0)))) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              append(&local_70," ");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              _M_append(&local_70,(pSVar4->text)._M_dataplus._M_p,(pSVar4->text)._M_string_length);
              sVar5 = sVar5 + 1;
            }
            uVar3 = uVar3 + 1;
            pSVar4 = pSVar4 + 1;
          } while (uVar3 < uVar2);
        }
        bVar6 = Library::PropertyNameExists
                          ((local_48->
                           super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,&local_70);
        if (bVar6) {
          if (local_38 != (size_t *)0x0) {
            *local_38 = sVar5;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            MemFree(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (bVar6) {
            return true;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                  *)local_70._M_dataplus._M_p != &local_70.field_2) {
          MemFree(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        uVar2 = uVar2 - 1;
        bVar6 = uVar2 != 0;
      } while (bVar6);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline_t bool Parser::CheckPropertyName(LibraryIPtr library, SymbolListCItr currSym, size_t * symCount) const
	{
		// Internal function called once we've established a library to check
		// Check up to the max number of parts

		// Initial error checks
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check for names starting with max property count
		auto maxParts = library->GetMaxPropertyParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = currSym;
			auto name = String(curr->text);
			size_t sc = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++sc;
			}
			bool exists = library->PropertyNameExists(name);
			if (exists)
			{
				if (symCount)
					*symCount = sc;
				return true;
			}
		}
		return false;
	}